

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

void __thiscall tokenizer::read_identifier(tokenizer *this)

{
  char *pcVar1;
  size_type __len1;
  char __c;
  bool bVar2;
  int iVar3;
  
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  __c = *this->line_char;
  if (__c != '\0') {
    do {
      iVar3 = isalnum((int)__c);
      if ((__c != '_') && (iVar3 == 0)) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->current_word,__c);
      pcVar1 = this->line_char;
      this->line_char = pcVar1 + 1;
      __c = pcVar1[1];
    } while (__c != '\0');
  }
  bVar2 = read_keyword_if_any(this);
  if (!bVar2) {
    add_token_to_stream(this,identifier);
  }
  __len1 = (this->current_word)._M_string_length;
  this->position_number = this->position_number + (int)__len1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->current_word,0,__len1,"",0);
  return;
}

Assistant:

void tokenizer::read_identifier() {
    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(isalnum(*line_char) || *line_char == '_') {
            current_word += *line_char;
            line_char++;
        }
        else {
            break;
        }
    }

    if(!this->read_keyword_if_any()){
        this->add_token_to_stream(Token_Type::identifier);
    }

    position_number += current_word.length();
    current_word = "";
}